

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixLookAt(Matrix *__return_storage_ptr__,Vector3 eye,Vector3 target,Vector3 up)

{
  float fVar1;
  Vector3 VVar2;
  Vector3 VVar3;
  Vector3 v1;
  Matrix *result;
  float local_180;
  float local_158;
  float fStack_154;
  Vector3 y;
  float local_140;
  float local_e8;
  float fStack_e4;
  Vector3 x;
  float local_d0;
  float local_78;
  float fStack_74;
  Vector3 z;
  Vector3 up_local;
  Vector3 target_local;
  Vector3 eye_local;
  
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  VVar2 = Vector3Subtract(eye,target);
  VVar2 = Vector3Normalize(VVar2);
  local_d0 = VVar2.z;
  VVar3 = Vector3CrossProduct(up,VVar2);
  VVar3 = Vector3Normalize(VVar3);
  local_140 = VVar3.z;
  v1 = Vector3CrossProduct(VVar2,VVar3);
  local_180 = v1.z;
  local_e8 = VVar3.x;
  __return_storage_ptr__->m0 = local_e8;
  local_158 = v1.x;
  __return_storage_ptr__->m1 = local_158;
  local_78 = VVar2.x;
  __return_storage_ptr__->m2 = local_78;
  __return_storage_ptr__->m3 = 0.0;
  fStack_e4 = VVar3.y;
  __return_storage_ptr__->m4 = fStack_e4;
  fStack_154 = v1.y;
  __return_storage_ptr__->m5 = fStack_154;
  fStack_74 = VVar2.y;
  __return_storage_ptr__->m6 = fStack_74;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m8 = local_140;
  __return_storage_ptr__->m9 = local_180;
  __return_storage_ptr__->m10 = local_d0;
  __return_storage_ptr__->m11 = 0.0;
  fVar1 = Vector3DotProduct(VVar3,eye);
  __return_storage_ptr__->m12 = -fVar1;
  fVar1 = Vector3DotProduct(v1,eye);
  __return_storage_ptr__->m13 = -fVar1;
  fVar1 = Vector3DotProduct(VVar2,eye);
  __return_storage_ptr__->m14 = -fVar1;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixLookAt(Vector3 eye, Vector3 target, Vector3 up)
{
    Matrix result = { 0 };

    Vector3 z = Vector3Subtract(eye, target);
    z = Vector3Normalize(z);
    Vector3 x = Vector3CrossProduct(up, z);
    x = Vector3Normalize(x);
    Vector3 y = Vector3CrossProduct(z, x);

    result.m0 = x.x;
    result.m1 = y.x;
    result.m2 = z.x;
    result.m3 = 0.0f;
    result.m4 = x.y;
    result.m5 = y.y;
    result.m6 = z.y;
    result.m7 = 0.0f;
    result.m8 = x.z;
    result.m9 = y.z;
    result.m10 = z.z;
    result.m11 = 0.0f;
    result.m12 = -Vector3DotProduct(x, eye);
    result.m13 = -Vector3DotProduct(y, eye);
    result.m14 = -Vector3DotProduct(z, eye);
    result.m15 = 1.0f;

    return result;
}